

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *
__thiscall
Parser::parseCallArgumentList_abi_cxx11_
          (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
           *__return_storage_ptr__,Parser *this)

{
  size_t *psVar1;
  undefined8 uVar2;
  anon_class_8_1_8991fb9c_conflict aVar3;
  Token *pTVar4;
  _List_node_base *p_Var5;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_class_8_1_8991fb9c_conflict local_b8 [3];
  undefined1 local_a0 [8];
  undefined1 local_98 [32];
  byte local_78;
  Mark local_70;
  Token local_68;
  
  local_a0 = (undefined1  [8])(local_98 + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"Expected open parenthesis!","");
  expectToken(this,LParen,(string *)local_a0);
  if (local_a0 != (undefined1  [8])(local_98 + 8)) {
    operator_delete((void *)local_a0,local_98._8_8_ + 1);
  }
  (__return_storage_ptr__->
  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  )._M_impl._M_node._M_size = 0;
  pTVar4 = Tokenizer::peek(&this->tokenizer_);
  local_a0._0_4_ = pTVar4->type;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)local_98,
                    (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&pTVar4->value);
  local_70 = pTVar4->mark;
  if (local_a0._0_4_ != RParen) {
    parseCallArgument((Parser *)local_d8);
    p_Var5 = (_List_node_base *)operator_new(0x20);
    uVar2 = local_d8._8_8_;
    local_d8._8_4_ = 0;
    local_d8._12_4_ = 0;
    p_Var5[1]._M_next = (_List_node_base *)local_d8._0_8_;
    p_Var5[1]._M_prev = (_List_node_base *)uVar2;
    local_d8._0_8_ = (istream *)0x0;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(__return_storage_ptr__->
              super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pTVar4 = Tokenizer::peek(&this->tokenizer_);
    local_a0._0_4_ = pTVar4->type;
    local_b8[0].this =
         (_Copy_assign_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
          *)local_98;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr
      [*(__index_type *)
        ((long)&(pTVar4->value).
                super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
                super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
                super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double> + 0x20)].
      _M_data)(local_b8,&pTVar4->value);
    local_70 = pTVar4->mark;
    if (local_a0._0_4_ == Comma) {
      do {
        Tokenizer::nextToken(&local_68,&this->tokenizer_);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
          ::_S_vtable._M_arr
          [local_68.value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
                  ((anon_class_1_0_00000001 *)local_b8,&local_68.value);
        local_68.value.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index = 0xff;
        parseCallArgument((Parser *)local_b8);
        aVar3.this = (_Copy_assign_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                      *)local_b8[1];
        local_d8._0_8_ = local_b8[0];
        uVar2 = local_d8._8_8_;
        local_b8[0].this =
             (_Copy_assign_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)0x0;
        local_b8[1].this =
             (_Copy_assign_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)0x0;
        local_d8._8_8_ = aVar3.this;
        if ((Mark)uVar2 != (Mark)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
          if ((Mark)local_b8[1].this != (Mark)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8[1].this);
          }
        }
        p_Var5 = (_List_node_base *)operator_new(0x20);
        uVar2 = local_d8._8_8_;
        local_d8._8_4_ = 0;
        local_d8._12_4_ = 0;
        p_Var5[1]._M_next = (_List_node_base *)local_d8._0_8_;
        p_Var5[1]._M_prev = (_List_node_base *)uVar2;
        local_d8._0_8_ = (istream *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        psVar1 = &(__return_storage_ptr__->
                  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        pTVar4 = Tokenizer::peek(&this->tokenizer_);
        local_a0._0_4_ = pTVar4->type;
        local_b8[0].this =
             (_Copy_assign_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)local_98;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
          ::_S_vtable._M_arr
          [*(__index_type *)
            ((long)&(pTVar4->value).
                    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
                    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
                    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double> + 0x20)].
          _M_data)(local_b8,&pTVar4->value);
        local_70 = pTVar4->mark;
      } while (local_a0._0_4_ == Comma);
    }
    if ((Mark)local_d8._8_8_ != (Mark)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
  }
  local_d8._0_8_ = (istream *)(local_d8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"Expected closing parenthesis!","");
  expectToken(this,RParen,(string *)local_d8);
  if ((istream *)local_d8._0_8_ != (istream *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr[local_78]._M_data)
            ((anon_class_1_0_00000001 *)local_d8,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)local_98);
  return __return_storage_ptr__;
}

Assistant:

std::list<std::shared_ptr<ExpressionNode>> Parser::parseCallArgumentList()
{
  expectToken(TokenType::LParen, "Expected open parenthesis!");
  std::list<std::shared_ptr<ExpressionNode>> arguments{};
  auto token = tokenizer_.peek();
  if(token.type != TokenType::RParen)
  {
    auto arg = parseCallArgument();
    arguments.push_back(std::move(arg));
    token = tokenizer_.peek();
    while(token.type == TokenType::Comma)
    {
      tokenizer_.nextToken();
      arg = parseCallArgument();
      arguments.push_back(std::move(arg));
      token = tokenizer_.peek();
    }
  }
  expectToken(TokenType::RParen, "Expected closing parenthesis!");

  return arguments;
}